

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

void __thiscall
common_arg::common_arg
          (common_arg *this,initializer_list<const_char_*> *args,string *help,
          _func_void_common_params_ptr *handler)

{
  initializer_list<const_char_*> __l;
  initializer_list<llama_example> __l_00;
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  allocator_type *__a;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffffa0;
  iterator ppcVar1;
  allocator_type *in_stack_ffffffffffffffb0;
  size_type sVar2;
  less<llama_example> *in_stack_ffffffffffffffb8;
  set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>
  *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  undefined1 *puVar4;
  
  uVar3 = 0;
  puVar4 = &stack0xffffffffffffffcc;
  __a = (allocator_type *)&stack0xffffffffffffffca;
  std::allocator<llama_example>::allocator((allocator<llama_example> *)0x1b1a70);
  __l_00._M_array._4_4_ = uVar3;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffffc8;
  __l_00._M_len = (size_type)puVar4;
  std::set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>::set
            (in_stack_ffffffffffffffc0,__l_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<llama_example>::~allocator((allocator<llama_example> *)0x1b1a9a);
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  std::set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>::set
            ((set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_> *)
             0x1b1abf);
  ppcVar1 = (iterator)*in_RSI;
  sVar2 = in_RSI[1];
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1b1aec);
  __l._M_len = sVar2;
  __l._M_array = ppcVar1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_ffffffffffffffa0,__l,__a);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1b1b11);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x90),in_RDX);
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = in_RCX;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  return;
}

Assistant:

common_arg(
        const std::initializer_list<const char *> & args,
        const std::string & help,
        void (*handler)(common_params & params)
    ) : args(args), help(help), handler_void(handler) {}